

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O3

void aom_smooth_h_predictor_8x32_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  ulong uVar1;
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  uint uVar39;
  short sVar40;
  short sVar42;
  short sVar43;
  short sVar44;
  short sVar45;
  short sVar46;
  short sVar47;
  undefined1 auVar41 [16];
  short sVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  ushort uVar55;
  ushort uVar56;
  ushort uVar58;
  ushort uVar59;
  ushort uVar60;
  ushort uVar61;
  ushort uVar62;
  ushort uVar63;
  ushort uVar64;
  ushort uVar65;
  ushort uVar66;
  ushort uVar67;
  ushort uVar68;
  ushort uVar69;
  undefined1 auVar57 [16];
  ushort uVar70;
  ushort uVar71;
  
  auVar41 = pshuflw(ZEXT116(top_row[7]),ZEXT116(top_row[7]),0);
  sVar47 = auVar41._0_2_;
  sVar48 = auVar41._2_2_;
  uVar1 = *(ulong *)left_column;
  auVar2._8_6_ = 0;
  auVar2._0_8_ = uVar1;
  auVar2[0xe] = (char)(uVar1 >> 0x38);
  auVar3._8_4_ = 0;
  auVar3._0_8_ = uVar1;
  auVar3[0xc] = (char)(uVar1 >> 0x30);
  auVar3._13_2_ = auVar2._13_2_;
  auVar7._8_4_ = 0;
  auVar7._0_8_ = uVar1;
  auVar7._12_3_ = auVar3._12_3_;
  auVar11._8_2_ = 0;
  auVar11._0_8_ = uVar1;
  auVar11[10] = (char)(uVar1 >> 0x28);
  auVar11._11_4_ = auVar7._11_4_;
  auVar15._8_2_ = 0;
  auVar15._0_8_ = uVar1;
  auVar15._10_5_ = auVar11._10_5_;
  auVar19[8] = (char)(uVar1 >> 0x20);
  auVar19._0_8_ = uVar1;
  auVar19._9_6_ = auVar15._9_6_;
  auVar27._7_8_ = 0;
  auVar27._0_7_ = auVar19._8_7_;
  auVar31._1_8_ = SUB158(auVar27 << 0x40,7);
  auVar31[0] = (char)(uVar1 >> 0x18);
  auVar31._9_6_ = 0;
  auVar32._1_10_ = SUB1510(auVar31 << 0x30,5);
  auVar32[0] = (char)(uVar1 >> 0x10);
  auVar32._11_4_ = 0;
  auVar26[2] = (char)(uVar1 >> 8);
  auVar26._0_2_ = (ushort)uVar1;
  auVar26._3_12_ = SUB1512(auVar32 << 0x20,3);
  auVar41._0_2_ = (ushort)uVar1 & 0xff;
  auVar41._2_13_ = auVar26._2_13_;
  auVar41[0xf] = 0;
  sVar40 = sVar47 + 0x80;
  sVar42 = sVar48 * 0x3b + 0x80;
  sVar43 = sVar47 * 0x6e + 0x80;
  sVar44 = sVar48 * 0x97 + 0x80;
  sVar45 = sVar47 * 0xb7 + 0x80;
  sVar46 = sVar48 * 0xce + 0x80;
  sVar47 = sVar47 * 0xdb + 0x80;
  sVar48 = sVar48 * 0xe0 + 0x80;
  uVar39 = 0xfefdfefe;
  do {
    uVar39 = uVar39 + 0x2020202;
    auVar57._4_4_ = uVar39;
    auVar57._0_4_ = uVar39;
    auVar57._8_4_ = uVar39;
    auVar57._12_4_ = uVar39;
    auVar57 = pshufb(auVar41,auVar57);
    uVar55 = auVar57._0_2_ * 0xff + sVar40;
    uVar58 = auVar57._2_2_ * 0xc5 + sVar42;
    uVar60 = auVar57._4_2_ * 0x92 + sVar43;
    uVar62 = auVar57._6_2_ * 0x69 + sVar44;
    uVar64 = auVar57._8_2_ * 0x49 + sVar45;
    uVar66 = auVar57._10_2_ * 0x32 + sVar46;
    uVar68 = auVar57._12_2_ * 0x25 + sVar47;
    uVar70 = auVar57._14_2_ * 0x20 + sVar48;
    uVar56 = uVar55 >> 8;
    uVar59 = uVar58 >> 8;
    uVar61 = uVar60 >> 8;
    uVar63 = uVar62 >> 8;
    uVar65 = uVar64 >> 8;
    uVar67 = uVar66 >> 8;
    uVar69 = uVar68 >> 8;
    uVar71 = uVar70 >> 8;
    *(ulong *)dst =
         CONCAT17((uVar71 != 0) * (uVar71 < 0x100) * (char)(uVar70 >> 8) - (0xff < uVar71),
                  CONCAT16((uVar69 != 0) * (uVar69 < 0x100) * (char)(uVar68 >> 8) - (0xff < uVar69),
                           CONCAT15((uVar67 != 0) * (uVar67 < 0x100) * (char)(uVar66 >> 8) -
                                    (0xff < uVar67),
                                    CONCAT14((uVar65 != 0) * (uVar65 < 0x100) * (char)(uVar64 >> 8)
                                             - (0xff < uVar65),
                                             CONCAT13((uVar63 != 0) * (uVar63 < 0x100) *
                                                      (char)(uVar62 >> 8) - (0xff < uVar63),
                                                      CONCAT12((uVar61 != 0) * (uVar61 < 0x100) *
                                                               (char)(uVar60 >> 8) - (0xff < uVar61)
                                                               ,CONCAT11((uVar59 != 0) *
                                                                         (uVar59 < 0x100) *
                                                                         (char)(uVar58 >> 8) -
                                                                         (0xff < uVar59),
                                                                         (uVar56 != 0) *
                                                                         (uVar56 < 0x100) *
                                                                         (char)(uVar55 >> 8) -
                                                                         (0xff < uVar56))))))));
    dst = dst + stride;
  } while (uVar39 < 0xd0c0d0d);
  uVar1 = *(ulong *)(left_column + 8);
  auVar4._8_6_ = 0;
  auVar4._0_8_ = uVar1;
  auVar4[0xe] = (char)(uVar1 >> 0x38);
  auVar8._8_4_ = 0;
  auVar8._0_8_ = uVar1;
  auVar8[0xc] = (char)(uVar1 >> 0x30);
  auVar8._13_2_ = auVar4._13_2_;
  auVar12._8_4_ = 0;
  auVar12._0_8_ = uVar1;
  auVar12._12_3_ = auVar8._12_3_;
  auVar16._8_2_ = 0;
  auVar16._0_8_ = uVar1;
  auVar16[10] = (char)(uVar1 >> 0x28);
  auVar16._11_4_ = auVar12._11_4_;
  auVar20._8_2_ = 0;
  auVar20._0_8_ = uVar1;
  auVar20._10_5_ = auVar16._10_5_;
  auVar23[8] = (char)(uVar1 >> 0x20);
  auVar23._0_8_ = uVar1;
  auVar23._9_6_ = auVar20._9_6_;
  auVar28._7_8_ = 0;
  auVar28._0_7_ = auVar23._8_7_;
  auVar33._1_8_ = SUB158(auVar28 << 0x40,7);
  auVar33[0] = (char)(uVar1 >> 0x18);
  auVar33._9_6_ = 0;
  auVar34._1_10_ = SUB1510(auVar33 << 0x30,5);
  auVar34[0] = (char)(uVar1 >> 0x10);
  auVar34._11_4_ = 0;
  auVar49._3_12_ = SUB1512(auVar34 << 0x20,3);
  auVar49[2] = (char)(uVar1 >> 8);
  auVar49[0] = (byte)uVar1;
  auVar49[1] = 0;
  auVar49[0xf] = 0;
  uVar39 = 0xfefdfefe;
  do {
    uVar39 = uVar39 + 0x2020202;
    auVar52._4_4_ = uVar39;
    auVar52._0_4_ = uVar39;
    auVar52._8_4_ = uVar39;
    auVar52._12_4_ = uVar39;
    auVar41 = pshufb(auVar49,auVar52);
    uVar55 = auVar41._0_2_ * 0xff + sVar40;
    uVar58 = auVar41._2_2_ * 0xc5 + sVar42;
    uVar60 = auVar41._4_2_ * 0x92 + sVar43;
    uVar62 = auVar41._6_2_ * 0x69 + sVar44;
    uVar64 = auVar41._8_2_ * 0x49 + sVar45;
    uVar66 = auVar41._10_2_ * 0x32 + sVar46;
    uVar68 = auVar41._12_2_ * 0x25 + sVar47;
    uVar70 = auVar41._14_2_ * 0x20 + sVar48;
    uVar56 = uVar55 >> 8;
    uVar59 = uVar58 >> 8;
    uVar61 = uVar60 >> 8;
    uVar63 = uVar62 >> 8;
    uVar65 = uVar64 >> 8;
    uVar67 = uVar66 >> 8;
    uVar69 = uVar68 >> 8;
    uVar71 = uVar70 >> 8;
    *(ulong *)dst =
         CONCAT17((uVar71 != 0) * (uVar71 < 0x100) * (char)(uVar70 >> 8) - (0xff < uVar71),
                  CONCAT16((uVar69 != 0) * (uVar69 < 0x100) * (char)(uVar68 >> 8) - (0xff < uVar69),
                           CONCAT15((uVar67 != 0) * (uVar67 < 0x100) * (char)(uVar66 >> 8) -
                                    (0xff < uVar67),
                                    CONCAT14((uVar65 != 0) * (uVar65 < 0x100) * (char)(uVar64 >> 8)
                                             - (0xff < uVar65),
                                             CONCAT13((uVar63 != 0) * (uVar63 < 0x100) *
                                                      (char)(uVar62 >> 8) - (0xff < uVar63),
                                                      CONCAT12((uVar61 != 0) * (uVar61 < 0x100) *
                                                               (char)(uVar60 >> 8) - (0xff < uVar61)
                                                               ,CONCAT11((uVar59 != 0) *
                                                                         (uVar59 < 0x100) *
                                                                         (char)(uVar58 >> 8) -
                                                                         (0xff < uVar59),
                                                                         (uVar56 != 0) *
                                                                         (uVar56 < 0x100) *
                                                                         (char)(uVar55 >> 8) -
                                                                         (0xff < uVar56))))))));
    dst = dst + stride;
  } while (uVar39 < 0xd0c0d0d);
  uVar1 = *(ulong *)(left_column + 0x10);
  auVar5._8_6_ = 0;
  auVar5._0_8_ = uVar1;
  auVar5[0xe] = (char)(uVar1 >> 0x38);
  auVar9._8_4_ = 0;
  auVar9._0_8_ = uVar1;
  auVar9[0xc] = (char)(uVar1 >> 0x30);
  auVar9._13_2_ = auVar5._13_2_;
  auVar13._8_4_ = 0;
  auVar13._0_8_ = uVar1;
  auVar13._12_3_ = auVar9._12_3_;
  auVar17._8_2_ = 0;
  auVar17._0_8_ = uVar1;
  auVar17[10] = (char)(uVar1 >> 0x28);
  auVar17._11_4_ = auVar13._11_4_;
  auVar21._8_2_ = 0;
  auVar21._0_8_ = uVar1;
  auVar21._10_5_ = auVar17._10_5_;
  auVar24[8] = (char)(uVar1 >> 0x20);
  auVar24._0_8_ = uVar1;
  auVar24._9_6_ = auVar21._9_6_;
  auVar29._7_8_ = 0;
  auVar29._0_7_ = auVar24._8_7_;
  auVar35._1_8_ = SUB158(auVar29 << 0x40,7);
  auVar35[0] = (char)(uVar1 >> 0x18);
  auVar35._9_6_ = 0;
  auVar36._1_10_ = SUB1510(auVar35 << 0x30,5);
  auVar36[0] = (char)(uVar1 >> 0x10);
  auVar36._11_4_ = 0;
  auVar50._3_12_ = SUB1512(auVar36 << 0x20,3);
  auVar50[2] = (char)(uVar1 >> 8);
  auVar50[0] = (byte)uVar1;
  auVar50[1] = 0;
  auVar50[0xf] = 0;
  uVar39 = 0xfefdfefe;
  do {
    uVar39 = uVar39 + 0x2020202;
    auVar53._4_4_ = uVar39;
    auVar53._0_4_ = uVar39;
    auVar53._8_4_ = uVar39;
    auVar53._12_4_ = uVar39;
    auVar41 = pshufb(auVar50,auVar53);
    uVar55 = auVar41._0_2_ * 0xff + sVar40;
    uVar58 = auVar41._2_2_ * 0xc5 + sVar42;
    uVar60 = auVar41._4_2_ * 0x92 + sVar43;
    uVar62 = auVar41._6_2_ * 0x69 + sVar44;
    uVar64 = auVar41._8_2_ * 0x49 + sVar45;
    uVar66 = auVar41._10_2_ * 0x32 + sVar46;
    uVar68 = auVar41._12_2_ * 0x25 + sVar47;
    uVar70 = auVar41._14_2_ * 0x20 + sVar48;
    uVar56 = uVar55 >> 8;
    uVar59 = uVar58 >> 8;
    uVar61 = uVar60 >> 8;
    uVar63 = uVar62 >> 8;
    uVar65 = uVar64 >> 8;
    uVar67 = uVar66 >> 8;
    uVar69 = uVar68 >> 8;
    uVar71 = uVar70 >> 8;
    *(ulong *)dst =
         CONCAT17((uVar71 != 0) * (uVar71 < 0x100) * (char)(uVar70 >> 8) - (0xff < uVar71),
                  CONCAT16((uVar69 != 0) * (uVar69 < 0x100) * (char)(uVar68 >> 8) - (0xff < uVar69),
                           CONCAT15((uVar67 != 0) * (uVar67 < 0x100) * (char)(uVar66 >> 8) -
                                    (0xff < uVar67),
                                    CONCAT14((uVar65 != 0) * (uVar65 < 0x100) * (char)(uVar64 >> 8)
                                             - (0xff < uVar65),
                                             CONCAT13((uVar63 != 0) * (uVar63 < 0x100) *
                                                      (char)(uVar62 >> 8) - (0xff < uVar63),
                                                      CONCAT12((uVar61 != 0) * (uVar61 < 0x100) *
                                                               (char)(uVar60 >> 8) - (0xff < uVar61)
                                                               ,CONCAT11((uVar59 != 0) *
                                                                         (uVar59 < 0x100) *
                                                                         (char)(uVar58 >> 8) -
                                                                         (0xff < uVar59),
                                                                         (uVar56 != 0) *
                                                                         (uVar56 < 0x100) *
                                                                         (char)(uVar55 >> 8) -
                                                                         (0xff < uVar56))))))));
    dst = dst + stride;
  } while (uVar39 < 0xd0c0d0d);
  uVar1 = *(ulong *)(left_column + 0x18);
  auVar6._8_6_ = 0;
  auVar6._0_8_ = uVar1;
  auVar6[0xe] = (char)(uVar1 >> 0x38);
  auVar10._8_4_ = 0;
  auVar10._0_8_ = uVar1;
  auVar10[0xc] = (char)(uVar1 >> 0x30);
  auVar10._13_2_ = auVar6._13_2_;
  auVar14._8_4_ = 0;
  auVar14._0_8_ = uVar1;
  auVar14._12_3_ = auVar10._12_3_;
  auVar18._8_2_ = 0;
  auVar18._0_8_ = uVar1;
  auVar18[10] = (char)(uVar1 >> 0x28);
  auVar18._11_4_ = auVar14._11_4_;
  auVar22._8_2_ = 0;
  auVar22._0_8_ = uVar1;
  auVar22._10_5_ = auVar18._10_5_;
  auVar25[8] = (char)(uVar1 >> 0x20);
  auVar25._0_8_ = uVar1;
  auVar25._9_6_ = auVar22._9_6_;
  auVar30._7_8_ = 0;
  auVar30._0_7_ = auVar25._8_7_;
  auVar37._1_8_ = SUB158(auVar30 << 0x40,7);
  auVar37[0] = (char)(uVar1 >> 0x18);
  auVar37._9_6_ = 0;
  auVar38._1_10_ = SUB1510(auVar37 << 0x30,5);
  auVar38[0] = (char)(uVar1 >> 0x10);
  auVar38._11_4_ = 0;
  auVar51._3_12_ = SUB1512(auVar38 << 0x20,3);
  auVar51[2] = (char)(uVar1 >> 8);
  auVar51[0] = (byte)uVar1;
  auVar51[1] = 0;
  auVar51[0xf] = 0;
  uVar39 = 0xfefdfefe;
  do {
    uVar39 = uVar39 + 0x2020202;
    auVar54._4_4_ = uVar39;
    auVar54._0_4_ = uVar39;
    auVar54._8_4_ = uVar39;
    auVar54._12_4_ = uVar39;
    auVar41 = pshufb(auVar51,auVar54);
    uVar55 = auVar41._0_2_ * 0xff + sVar40;
    uVar58 = auVar41._2_2_ * 0xc5 + sVar42;
    uVar60 = auVar41._4_2_ * 0x92 + sVar43;
    uVar62 = auVar41._6_2_ * 0x69 + sVar44;
    uVar64 = auVar41._8_2_ * 0x49 + sVar45;
    uVar66 = auVar41._10_2_ * 0x32 + sVar46;
    uVar68 = auVar41._12_2_ * 0x25 + sVar47;
    uVar70 = auVar41._14_2_ * 0x20 + sVar48;
    uVar56 = uVar55 >> 8;
    uVar59 = uVar58 >> 8;
    uVar61 = uVar60 >> 8;
    uVar63 = uVar62 >> 8;
    uVar65 = uVar64 >> 8;
    uVar67 = uVar66 >> 8;
    uVar69 = uVar68 >> 8;
    uVar71 = uVar70 >> 8;
    *(ulong *)dst =
         CONCAT17((uVar71 != 0) * (uVar71 < 0x100) * (char)(uVar70 >> 8) - (0xff < uVar71),
                  CONCAT16((uVar69 != 0) * (uVar69 < 0x100) * (char)(uVar68 >> 8) - (0xff < uVar69),
                           CONCAT15((uVar67 != 0) * (uVar67 < 0x100) * (char)(uVar66 >> 8) -
                                    (0xff < uVar67),
                                    CONCAT14((uVar65 != 0) * (uVar65 < 0x100) * (char)(uVar64 >> 8)
                                             - (0xff < uVar65),
                                             CONCAT13((uVar63 != 0) * (uVar63 < 0x100) *
                                                      (char)(uVar62 >> 8) - (0xff < uVar63),
                                                      CONCAT12((uVar61 != 0) * (uVar61 < 0x100) *
                                                               (char)(uVar60 >> 8) - (0xff < uVar61)
                                                               ,CONCAT11((uVar59 != 0) *
                                                                         (uVar59 < 0x100) *
                                                                         (char)(uVar58 >> 8) -
                                                                         (0xff < uVar59),
                                                                         (uVar56 != 0) *
                                                                         (uVar56 < 0x100) *
                                                                         (char)(uVar55 >> 8) -
                                                                         (0xff < uVar56))))))));
    dst = dst + stride;
  } while (uVar39 < 0xd0c0d0d);
  return;
}

Assistant:

void aom_smooth_h_predictor_8x32_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  const __m128i top_right = _mm_set1_epi16(top_row[7]);
  const __m128i weights = cvtepu8_epi16(LoadLo8(smooth_weights + 4));
  const __m128i scale = _mm_set1_epi16(1 << SMOOTH_WEIGHT_LOG2_SCALE);
  const __m128i inverted_weights = _mm_sub_epi16(scale, weights);
  const __m128i scaled_top_right = _mm_mullo_epi16(inverted_weights, top_right);
  const __m128i round = _mm_set1_epi16(1 << (SMOOTH_WEIGHT_LOG2_SCALE - 1));
  __m128i left = cvtepu8_epi16(LoadLo8(left_column));
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i left_y = _mm_shuffle_epi8(left, y_select);
    write_smooth_directional_sum8(dst, &left_y, &weights, &scaled_top_right,
                                  &round);
    dst += stride;
  }
  left = cvtepu8_epi16(LoadLo8(left_column + 8));
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i left_y = _mm_shuffle_epi8(left, y_select);
    write_smooth_directional_sum8(dst, &left_y, &weights, &scaled_top_right,
                                  &round);
    dst += stride;
  }
  left = cvtepu8_epi16(LoadLo8(left_column + 16));
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i left_y = _mm_shuffle_epi8(left, y_select);
    write_smooth_directional_sum8(dst, &left_y, &weights, &scaled_top_right,
                                  &round);
    dst += stride;
  }
  left = cvtepu8_epi16(LoadLo8(left_column + 24));
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i left_y = _mm_shuffle_epi8(left, y_select);
    write_smooth_directional_sum8(dst, &left_y, &weights, &scaled_top_right,
                                  &round);
    dst += stride;
  }
}